

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

tuple<double,_long>
findBestCC<short>(TWaveformViewT<short> *waveform0,TWaveformViewT<short> *waveform1,
                 int64_t alignWindow)

{
  long lVar1;
  long in_RCX;
  TWaveformViewT<short> *in_RDX;
  TWaveformViewT<short> *in_RSI;
  _Tuple_impl<1UL,_long> in_RDI;
  TValueCC TVar2;
  _Head_base<0UL,_double,_false> extraout_XMM0_Qa;
  tuple<double,_long> tVar3;
  TValueCC cc;
  int o;
  __tuple_element_t<1UL,_tuple<long,_long>_> sum02;
  __tuple_element_t<0UL,_tuple<long,_long>_> sum0;
  tuple<long,_long> ret;
  short *samples1;
  int64_t n0;
  TOffset besto;
  TValueCC bestcc;
  double *in_stack_ffffffffffffff68;
  _Head_base<1UL,_long,_false> this;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar4;
  double sum02_00;
  
  sum02_00 = -1.0;
  this = in_RDI.super__Head_base<1UL,_long,_false>._M_head_impl;
  calcSum<short>((TWaveformViewT<short> *)
                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::get<0ul,long,long>((tuple<long,_long> *)0x1377f5);
  std::get<1ul,long,long>((tuple<long,_long> *)0x137807);
  for (iVar4 = 0; lVar1 = (long)iVar4,
      lVar1 == in_RCX * 2 || SBORROW8(lVar1,in_RCX * 2) != lVar1 + in_RCX * -2 < 0;
      iVar4 = iVar4 + 1) {
    TVar2 = calcCC<short>(in_RSI,in_RDX,in_RCX,(int64_t)sum02_00);
    if (sum02_00 < TVar2) {
      sum02_00 = TVar2;
    }
  }
  std::tuple<double,_long>::tuple<double_&,_long_&,_true>
            ((tuple<double,_long> *)this._M_head_impl,in_stack_ffffffffffffff68,(long *)0x1378b9);
  tVar3.super__Tuple_impl<0UL,_double,_long>.super__Head_base<0UL,_double,_false>._M_head_impl =
       extraout_XMM0_Qa._M_head_impl;
  tVar3.super__Tuple_impl<0UL,_double,_long>.super__Tuple_impl<1UL,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl =
       in_RDI.super__Head_base<1UL,_long,_false>._M_head_impl;
  return (tuple<double,_long>)tVar3.super__Tuple_impl<0UL,_double,_long>;
}

Assistant:

std::tuple<TValueCC, TOffset> findBestCC(
    const TWaveformViewT<T> & waveform0,
    const TWaveformViewT<T> & waveform1,
    int64_t alignWindow) {
    TValueCC bestcc = -1.0;
    TOffset besto = -1;

    //auto samples0 = waveform0.samples;
    auto n0       = waveform0.n;

    auto samples1 = waveform1.samples;

#ifdef MY_DEBUG
    auto n1 = waveform1.n;
    if (n0 + 2*alignWindow != n1) {
        printf("BUG 924830jm92, n0 = %d, a = %d\n", (int) n0, (int) alignWindow);
    }
#endif

    auto ret = calcSum(waveform0);
    auto sum0  = std::get<0>(ret);
    auto sum02 = std::get<1>(ret);

    for (int o = 0; o <= 2*alignWindow; ++o) {
        auto cc = calcCC(waveform0, { samples1 + o, n0 }, sum0, sum02);
        if (cc > bestcc) {
            besto = o - alignWindow;
            bestcc = cc;
        }
    }

    return std::tuple<TValueCC, TOffset>(bestcc, besto);
}